

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w,MissingAction missing_action,double *x_sd,double *x_mean)

{
  size_t row;
  size_t *key;
  undefined4 uVar1;
  undefined4 uVar2;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar3;
  tuple<> local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_38;
  
  key = ix_arr + st;
  do {
    local_48 = (double)x[*key];
    if (NAN(x[*key])) {
      if (end < st) {
LAB_0026816a:
        if (end < st) {
          local_40 = NAN;
          uVar1 = 0;
          uVar2 = 0;
        }
        else {
          local_40 = 0.0;
          local_68 = 0.0;
          local_60 = 0.0;
          do {
            local_58 = (double)x[*key];
            if ((!NAN(x[*key])) && (ABS(local_58) != INFINITY)) {
              local_38._M_head_impl = key;
              pVar3 = tsl::detail_robin_hash::
                      robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                      ::
                      insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                  *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                 (tuple<const_unsigned_long_&> *)&local_38,&local_69);
              local_50 = *(double *)((pVar3.first.m_bucket.m_bucket)->m_value + 8);
              local_60 = local_60 + local_50;
              local_68 = fma(local_50,(local_58 - local_68) / local_60,local_68);
              local_40 = fma(local_50,(local_58 - local_48) * (local_58 - local_68),local_40);
              local_48 = local_68;
            }
            st = st + 1;
            key = key + 1;
          } while (st <= end);
          local_40 = local_40 / local_60;
          uVar1 = SUB84(local_68,0);
          uVar2 = (undefined4)((ulong)local_68 >> 0x20);
        }
        *x_mean = (double)CONCAT44(uVar2,uVar1);
        *x_sd = SQRT(local_40);
        return;
      }
    }
    else if ((end < st) || (ABS(local_48) != INFINITY)) goto LAB_0026816a;
    st = st + 1;
    key = key + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}